

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O2

void copy_slays(_Bool **dest,_Bool *source)

{
  byte bVar1;
  slay_conflict *psVar2;
  _Bool _Var3;
  _Bool *p_Var4;
  ulong uVar5;
  _Bool *p_Var6;
  int *piVar7;
  ulong uVar8;
  
  if (source != (_Bool *)0x0) {
    p_Var4 = *dest;
    if (p_Var4 == (_Bool *)0x0) {
      p_Var4 = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
      *dest = p_Var4;
    }
    bVar1 = z_info->slay_max;
    for (uVar5 = 0; bVar1 != uVar5; uVar5 = uVar5 + 1) {
      p_Var4[uVar5] = (_Bool)(p_Var4[uVar5] | source[uVar5]);
    }
    for (uVar5 = 0; uVar5 != bVar1; uVar5 = uVar5 + 1) {
      psVar2 = slays + uVar5;
      piVar7 = &slays->multiplier;
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        if (((p_Var4[uVar5] == true) && (p_Var4[uVar8] == true)) &&
           (_Var3 = same_monsters_slain((wchar_t)uVar5,(wchar_t)uVar8), _Var3)) {
          p_Var6 = p_Var4 + uVar8;
          if (psVar2->multiplier < *piVar7) {
            p_Var6 = p_Var4 + uVar5;
          }
          *p_Var6 = false;
        }
        piVar7 = piVar7 + 0xe;
      }
    }
  }
  return;
}

Assistant:

void copy_slays(bool **dest, bool *source)
{
	int i, j;

	/* Check structures */
	if (!source) return;
	if (!(*dest)) {
		*dest = mem_zalloc(z_info->slay_max * sizeof(bool));
	}

	/* Copy */
	for (i = 0; i < z_info->slay_max; i++) {
		(*dest)[i] |= source[i];
	}

	/* Check for duplicates */
	for (i = 0; i < z_info->slay_max; i++) {
		for (j = 0; j < i; j++) {
			if ((*dest)[i] && (*dest)[j] && same_monsters_slain(i, j)) {
				if (slays[i].multiplier < slays[j].multiplier) {
					(*dest)[i] = false;
				} else {
					(*dest)[j] = false;
				}
			}
		}
	}
}